

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::SerializeToCodedStream(MessageLite *this,CodedOutputStream *output)

{
  bool bVar1;
  MessageLite *in_R8;
  string_view action;
  LogMessage local_40;
  string local_30;
  
  bVar1 = IsInitialized(this);
  if (bVar1) {
    bVar1 = SerializePartialToCodedStream(this,output);
    return bVar1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
             ,0x1f8,"IsInitialized()");
  action._M_str = (char *)this;
  action._M_len = (size_t)"serialize";
  (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
            (&local_30,(_anonymous_namespace_ *)0x9,action,in_R8);
  absl::lts_20250127::log_internal::LogMessage::operator<<(&local_40,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

bool MessageLite::SerializeToCodedStream(io::CodedOutputStream* output) const {
  ABSL_DCHECK(IsInitialized())
      << InitializationErrorMessage("serialize", *this);
  return SerializePartialToCodedStream(output);
}